

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

void __thiscall QBooleanComboBox::QBooleanComboBox(QBooleanComboBox *this,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QComboBox::QComboBox((QComboBox *)this,parent);
  *(undefined ***)this = &PTR_metaObject_007e62e0;
  *(undefined ***)(this + 0x10) = &PTR__QBooleanComboBox_007e64b0;
  QComboBox::tr((QString *)&local_70,"False",(char *)0x0,-1);
  local_58._16_8_ = 0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_40 = 2;
  QComboBox::addItem((QComboBox *)this,(QString *)&local_70,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QComboBox::tr((QString *)&local_70,"True",(char *)0x0,-1);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QComboBox::addItem((QComboBox *)this,(QString *)&local_70,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QBooleanComboBox::QBooleanComboBox(QWidget *parent)
    : QComboBox(parent)
{
    addItem(QComboBox::tr("False"));
    addItem(QComboBox::tr("True"));
}